

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetElementIHelper
              (Var instance,Var index,Var receiver,ScriptContext *scriptContext)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  IndexType IVar5;
  BOOL BVar6;
  PropertyId PVar7;
  JavascriptLibrary *this;
  undefined4 *puVar8;
  PropertyRecord *local_f0;
  PropertyRecord *debugPropertyRecord;
  JavascriptString *indexStr;
  PropertyValueInfo info_1;
  PropertyValueInfo info;
  Var pvStack_58;
  IndexType indexType;
  Var value;
  JavascriptString *propertyNameString;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_38;
  uint32 indexVal;
  RecyclableObject *object;
  ScriptContext *scriptContext_local;
  Var receiver_local;
  Var index_local;
  Var instance_local;
  
  pRStack_38 = (RecyclableObject *)0x0;
  object = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)receiver;
  receiver_local = index;
  index_local = instance;
  bVar4 = GetPropertyObjectForGetElementI(instance,index,scriptContext,&stack0xffffffffffffffc8);
  if (bVar4) {
    propertyNameString = (JavascriptString *)0x0;
    value = (Var)0x0;
    pvStack_58 = (Var)0x0;
    IVar5 = GetIndexType(&receiver_local,(ScriptContext *)object,
                         (uint32 *)((long)&propertyRecord + 4),
                         (PropertyRecord **)&propertyNameString,(JavascriptString **)&value,false,
                         true);
    if (IVar5 == IndexType_Number) {
      BVar6 = GetItem(scriptContext_local,pRStack_38,propertyRecord._4_4_,&stack0xffffffffffffffa8,
                      (ScriptContext *)object);
      if (BVar6 != 0) {
        return pvStack_58;
      }
    }
    else if (IVar5 == IndexType_JavascriptString) {
      PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&info_1.inlineCacheIndex);
      BVar6 = GetPropertyWPCache<false,Js::JavascriptString*>
                        (scriptContext_local,pRStack_38,(JavascriptString *)value,
                         &stack0xffffffffffffffa8,(ScriptContext *)object,
                         (PropertyValueInfo *)&info_1.inlineCacheIndex);
      if (BVar6 != 0) {
        return pvStack_58;
      }
    }
    else {
      if (IVar5 != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1077,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      if ((propertyNameString == (JavascriptString *)0x0) &&
         (bVar4 = CanShortcutOnUnknownPropertyName(pRStack_38), !bVar4)) {
        IVar5 = GetIndexTypeFromPrimitive
                          (receiver_local,(ScriptContext *)object,
                           (uint32 *)((long)&propertyRecord + 4),
                           (PropertyRecord **)&propertyNameString,(JavascriptString **)&value,true,
                           true);
        if (IVar5 != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x107b,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (propertyNameString == (JavascriptString *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x107c,"(propertyRecord != nullptr)",
                                      "propertyRecord != nullptr");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
      }
      if (propertyNameString == (JavascriptString *)0x0) {
        debugPropertyRecord =
             (PropertyRecord *)
             JavascriptConversion::ToString(receiver_local,(ScriptContext *)object);
        ScriptContext::GetOrAddPropertyRecord
                  ((ScriptContext *)object,(JavascriptString *)debugPropertyRecord,&local_f0);
        pSVar3 = scriptContext_local;
        pRVar2 = pRStack_38;
        PVar7 = PropertyRecord::GetPropertyId(local_f0);
        BVar6 = GetProperty(pSVar3,pRVar2,PVar7,&stack0xffffffffffffffa8,(ScriptContext *)object,
                            (PropertyValueInfo *)0x0);
        if (BVar6 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x108d,
                                      "(!JavascriptOperators::GetProperty(receiver, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext))"
                                      ,
                                      "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
      }
      else {
        PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&indexStr);
        pSVar3 = scriptContext_local;
        pRVar2 = pRStack_38;
        PVar7 = PropertyRecord::GetPropertyId((PropertyRecord *)propertyNameString);
        BVar6 = GetPropertyWPCache<false,int>
                          (pSVar3,pRVar2,PVar7,&stack0xffffffffffffffa8,(ScriptContext *)object,
                           (PropertyValueInfo *)&indexStr);
        if (BVar6 != 0) {
          return pvStack_58;
        }
      }
    }
    instance_local = ScriptContext::GetMissingItemResult((ScriptContext *)object);
  }
  else {
    this = ScriptContext::GetLibrary((ScriptContext *)object);
    instance_local = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::GetElementIHelper(Var instance, Var index, Var receiver, ScriptContext* scriptContext)
    {
        RecyclableObject* object = nullptr;
        if (!JavascriptOperators::GetPropertyObjectForGetElementI(instance, index, scriptContext, &object))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        Var value = nullptr;

        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);

        if (indexType == IndexType_Number)
        {
            if (JavascriptOperators::GetItem(receiver, object, indexVal, &value, scriptContext))
            {
                return value;
            }
        }
        else if (indexType == IndexType_JavascriptString)
        {
            PropertyValueInfo info;
            if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(receiver, object, propertyNameString, &value, scriptContext, &info))
            {
                return value;
            }
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);
            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, true, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                PropertyValueInfo info;
                if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(receiver, object, propertyRecord->GetPropertyId(), &value, scriptContext, &info))
                {
                    return value;
                }
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::GetProperty(receiver, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext), "how did this property come? See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        return scriptContext->GetMissingItemResult();
    }